

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O3

_Bool xdr_ncallhdr(XDR *xdrs,rpc_msg *cmsg)

{
  xdr_op xVar1;
  _Bool _Var2;
  msg_type mVar3;
  uint32_t uVar4;
  uint uVar5;
  anon_struct_448_2_6e6c6d68_for_ru *paVar6;
  uint *puVar7;
  rpcvers_t *prVar8;
  msg_type *pmVar9;
  rpcprog_t *prVar10;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xa5,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
  }
  if (cmsg == (rpc_msg *)0x0) {
    __assert_fail("cmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xa6,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
  }
  cmsg->rm_direction = CALL;
  (cmsg->ru).RM_cmb = 2;
  if (xdrs->x_op == XDR_ENCODE) {
    uVar5 = cmsg->rm_xid;
    puVar7 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_wrap < puVar7) {
      _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
      if (!_Var2) goto LAB_001111f1;
    }
    else {
      *(uint *)xdrs->x_data =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
    }
    xVar1 = xdrs->x_op;
    if (xVar1 != XDR_FREE) {
      pmVar9 = &cmsg->rm_direction;
      if (xVar1 == XDR_DECODE) {
        paVar6 = (anon_struct_448_2_6e6c6d68_for_ru *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < paVar6) {
          _Var2 = (*xdrs->x_ops->x_getunit)(xdrs,pmVar9);
          goto LAB_0011126f;
        }
        mVar3 = *(msg_type *)xdrs->x_data;
LAB_0011127b:
        *pmVar9 = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
        xdrs->x_data = (uint8_t *)paVar6;
      }
      else {
        if (xVar1 != XDR_ENCODE) goto LAB_001111f1;
        mVar3 = *pmVar9;
        pmVar9 = (msg_type *)xdrs->x_data;
        paVar6 = (anon_struct_448_2_6e6c6d68_for_ru *)(pmVar9 + 1);
        if (paVar6 <= (xdrs->x_v).vio_wrap) goto LAB_0011127b;
        _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
LAB_0011126f:
        if (_Var2 == false) goto LAB_001111f1;
      }
      xVar1 = xdrs->x_op;
      if (xVar1 != XDR_FREE) {
        paVar6 = &cmsg->ru;
        if (xVar1 == XDR_DECODE) {
          puVar7 = (uint *)((long)xdrs->x_data + 4);
          if ((xdrs->x_v).vio_tail < puVar7) {
            _Var2 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar6);
            goto LAB_001112cf;
          }
          uVar4 = *(uint32_t *)xdrs->x_data;
LAB_001112db:
          (paVar6->RM_cmb).cb_rpcvers =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          xdrs->x_data = (uint8_t *)puVar7;
        }
        else {
          if (xVar1 != XDR_ENCODE) goto LAB_001111f1;
          uVar4 = (paVar6->RM_cmb).cb_rpcvers;
          paVar6 = (anon_struct_448_2_6e6c6d68_for_ru *)xdrs->x_data;
          puVar7 = (uint *)&paVar6->field_0x4;
          if (puVar7 <= (xdrs->x_v).vio_wrap) goto LAB_001112db;
          _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uVar4);
LAB_001112cf:
          if (_Var2 == false) goto LAB_001111f1;
        }
        xVar1 = xdrs->x_op;
        prVar10 = &cmsg->cb_prog;
        if (xVar1 == XDR_ENCODE) {
          uVar5 = *prVar10;
          prVar10 = (rpcprog_t *)xdrs->x_data;
          prVar8 = prVar10 + 1;
          if ((xdrs->x_v).vio_wrap < prVar8) {
            _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
            goto LAB_00111339;
          }
LAB_00111345:
          *prVar10 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
          ;
          xdrs->x_data = (uint8_t *)prVar8;
        }
        else {
          if (xVar1 != XDR_DECODE) {
            if (xVar1 != XDR_FREE) goto LAB_001111f1;
            goto LAB_001112ff;
          }
          prVar8 = (rpcvers_t *)((long)xdrs->x_data + 4);
          if (prVar8 <= (xdrs->x_v).vio_tail) {
            uVar5 = *(uint *)xdrs->x_data;
            goto LAB_00111345;
          }
          _Var2 = (*xdrs->x_ops->x_getunit)(xdrs,prVar10);
LAB_00111339:
          if (_Var2 == false) goto LAB_001111f1;
        }
        xVar1 = xdrs->x_op;
        if (xVar1 == XDR_FREE) {
          return true;
        }
        prVar8 = &cmsg->cb_vers;
        if (xVar1 == XDR_DECODE) {
          puVar7 = (uint *)((long)xdrs->x_data + 4);
          if (puVar7 <= (xdrs->x_v).vio_tail) {
            uVar5 = *(uint *)xdrs->x_data;
            *prVar8 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                      uVar5 << 0x18;
            xdrs->x_data = (uint8_t *)puVar7;
            return true;
          }
          _Var2 = (*xdrs->x_ops->x_getunit)(xdrs,prVar8);
          return _Var2;
        }
        if (xVar1 == XDR_ENCODE) {
          uVar5 = *prVar8;
          puVar7 = (uint *)((long)xdrs->x_data + 4);
          if (puVar7 <= (xdrs->x_v).vio_wrap) {
            *(uint *)xdrs->x_data =
                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            xdrs->x_data = (uint8_t *)puVar7;
            return true;
          }
          _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          return _Var2;
        }
        goto LAB_001111f1;
      }
    }
LAB_001112ff:
    _Var2 = true;
  }
  else {
LAB_001111f1:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool
xdr_ncallhdr(XDR *xdrs, struct rpc_msg *cmsg)
{
	assert(xdrs != NULL);
	assert(cmsg != NULL);

	cmsg->rm_direction = CALL;
	cmsg->rm_call.cb_rpcvers = RPC_MSG_VERSION;
	if ((xdrs->x_op == XDR_ENCODE)
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(cmsg->rm_direction))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_call.cb_rpcvers))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->cb_prog)))
		return (inline_xdr_u_int32_t(xdrs, &(cmsg->cb_vers)));
	return (false);
}